

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_checktype(lua_State *L,int narg,int t)

{
  int iVar1;
  int t_local;
  int narg_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,narg);
  if (iVar1 != t) {
    tag_error(L,narg,t);
  }
  return;
}

Assistant:

static void luaL_checktype(lua_State*L,int narg,int t){
if(lua_type(L,narg)!=t)
tag_error(L,narg,t);
}